

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

void __thiscall Assimp::STEP::LazyObject::LazyInit(LazyObject *this)

{
  uint64_t *puVar1;
  ConversionSchema *this_00;
  ConvertObjectProc p_Var2;
  Object *pOVar3;
  TypeError *this_01;
  string local_60;
  char *acopy;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> conv_args;
  
  this_00 = this->db->schema;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,this->type,(allocator<char> *)&conv_args);
  p_Var2 = EXPRESS::ConversionSchema::GetConverterProc(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (p_Var2 == (ConvertObjectProc)0x0) {
    this_01 = (TypeError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&conv_args,this->type,(allocator<char> *)&acopy);
    std::operator+(&local_60,"unknown object type: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conv_args);
    TypeError::TypeError(this_01,&local_60,this->id,0xffffffffffffffff);
    __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
  }
  acopy = this->args;
  EXPRESS::LIST::Parse((char **)&conv_args,(uint64_t)&acopy,(ConversionSchema *)0xffffffffffffffff);
  if (this->args != (char *)0x0) {
    operator_delete__(this->args);
  }
  this->args = (char *)0x0;
  pOVar3 = (*p_Var2)(this->db,conv_args.
                              super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  this->obj = pOVar3;
  puVar1 = &this->db->evaluated_count;
  *puVar1 = *puVar1 + 1;
  if (this->obj != (Object *)0x0) {
    this->obj->id = this->id;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&conv_args.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  __assert_fail("obj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                ,0x22b,"void Assimp::STEP::LazyObject::LazyInit() const");
}

Assistant:

void STEP::LazyObject::LazyInit() const {
    const EXPRESS::ConversionSchema& schema = db.GetSchema();
    STEP::ConvertObjectProc proc = schema.GetConverterProc(type);

    if (!proc) {
        throw STEP::TypeError("unknown object type: " + std::string(type),id);
    }

    const char* acopy = args;
    std::shared_ptr<const EXPRESS::LIST> conv_args = EXPRESS::LIST::Parse(acopy,STEP::SyntaxError::LINE_NOT_SPECIFIED,&db.GetSchema());
    delete[] args;
    args = NULL;

    // if the converter fails, it should throw an exception, but it should never return NULL
    try {
        obj = proc(db,*conv_args);
    }
    catch(const TypeError& t) {
        // augment line and entity information
        throw TypeError(t.what(),id);
    }
    ++db.evaluated_count;
    ai_assert(obj);

    // store the original id in the object instance
    obj->SetID(id);
}